

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalProgramTrigger.cpp
# Opt level: O0

void * ExternalProgramTriggerThread(void *pParam)

{
  undefined8 __stream;
  int iVar1;
  int iVar2;
  char *pcVar3;
  FILE *__stream_00;
  int local_194;
  undefined1 local_180 [8];
  CHRONO chrono;
  int i;
  FILE *file;
  char logexternalprogramtriggerfilename [256];
  FILE *logexternalprogramtriggerfile;
  int id;
  void *pParam_local;
  
  iVar1 = (int)pParam;
  logexternalprogramtriggerfilename[0xf8] = '\0';
  logexternalprogramtriggerfilename[0xf9] = '\0';
  logexternalprogramtriggerfilename[0xfa] = '\0';
  logexternalprogramtriggerfilename[0xfb] = '\0';
  logexternalprogramtriggerfilename[0xfc] = '\0';
  logexternalprogramtriggerfilename[0xfd] = '\0';
  logexternalprogramtriggerfilename[0xfe] = '\0';
  logexternalprogramtriggerfilename[0xff] = '\0';
  chrono._68_4_ = 0;
  EnterCriticalSection(&strtimeCS);
  pcVar3 = strtimeex_fns();
  sprintf((char *)&file,"log/logexternalprogramtrigger%d_%.64s.csv",(ulong)pParam & 0xffffffff,
          pcVar3);
  LeaveCriticalSection(&strtimeCS);
  logexternalprogramtriggerfilename._248_8_ = fopen((char *)&file,"w");
  if ((FILE *)logexternalprogramtriggerfilename._248_8_ == (FILE *)0x0) {
    printf("Unable to create log file.\n");
    if (bExit == 0) {
      bExit = 1;
    }
  }
  else {
    fprintf((FILE *)logexternalprogramtriggerfilename._248_8_,
            "%% Time (in s); Trigger (1 : on, 0 : off);\n");
    fflush((FILE *)logexternalprogramtriggerfilename._248_8_);
    StartChrono((CHRONO *)local_180);
    do {
      do {
        if (period_externalprogramtrigger[iVar1] < 1) {
          local_194 = 100;
        }
        else {
          local_194 = period_externalprogramtrigger[iVar1];
        }
        uSleep((long)(local_194 * 1000));
        if (bExit != 0) goto LAB_001a7a39;
      } while (bExternalProgramTrigger[iVar1] == 0);
      EnterCriticalSection(ExternalProgramTriggerCS + iVar1);
      __stream_00 = fopen(ExternalProgramTriggerFileName[iVar1],"r");
      if (__stream_00 != (FILE *)0x0) {
        fclose(__stream_00);
        __stream = logexternalprogramtriggerfilename._248_8_;
        bExternalProgramTriggerDetected[iVar1] = 1;
        GetTimeElapsedChronoQuick((CHRONO *)local_180);
        fprintf((FILE *)__stream,"%f;%d;\n",(ulong)(uint)bExternalProgramTriggerDetected[iVar1]);
        fflush((FILE *)logexternalprogramtriggerfilename._248_8_);
        if (procid_externalprogramtrigger[iVar1] != -1) {
          bExternalProgramTrigger[iVar1] = 0;
          chrono._68_4_ = 0;
          while (((int)chrono._68_4_ < nbretries_externalprogramtrigger[iVar1] &&
                 (iVar2 = remove(ExternalProgramTriggerFileName[iVar1]), iVar2 != 0))) {
            uSleep((long)(retrydelay_externalprogramtrigger[iVar1] * 1000));
            chrono._68_4_ = chrono._68_4_ + 1;
          }
          if (bEcho != 0) {
            printf("execute %d\n",(ulong)(uint)procid_externalprogramtrigger[iVar1]);
          }
          ExecuteProcedure(procid_externalprogramtrigger[iVar1]);
          bWaiting = 0;
        }
      }
      LeaveCriticalSection(ExternalProgramTriggerCS + iVar1);
    } while (bExit == 0);
LAB_001a7a39:
    StopChronoQuick((CHRONO *)local_180);
    fclose((FILE *)logexternalprogramtriggerfilename._248_8_);
    if (bExit == 0) {
      bExit = 1;
    }
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE ExternalProgramTriggerThread(void* pParam)
{
	int id = (int)(intptr_t)pParam;

	FILE* logexternalprogramtriggerfile = NULL;
	char logexternalprogramtriggerfilename[MAX_BUF_LEN];

	FILE* file = NULL;
	int i = 0;
	CHRONO chrono;

	EnterCriticalSection(&strtimeCS);
	sprintf(logexternalprogramtriggerfilename, LOG_FOLDER"logexternalprogramtrigger%d_%.64s.csv", id, strtimeex_fns());
	LeaveCriticalSection(&strtimeCS);
	logexternalprogramtriggerfile = fopen(logexternalprogramtriggerfilename, "w");
	if (logexternalprogramtriggerfile == NULL)
	{
		printf("Unable to create log file.\n");
		if (!bExit) bExit = TRUE; // Unexpected program exit...
		return 0;
	}

	fprintf(logexternalprogramtriggerfile, "%% Time (in s); Trigger (1 : on, 0 : off);\n");
	fflush(logexternalprogramtriggerfile);

	StartChrono(&chrono);

	for (;;)
	{
		uSleep(1000*(period_externalprogramtrigger[id] > 0? period_externalprogramtrigger[id]: 100));

		if (bExit) break;
		if (!bExternalProgramTrigger[id]) continue;

		EnterCriticalSection(&ExternalProgramTriggerCS[id]);

		file = fopen(ExternalProgramTriggerFileName[id], "r");
		if (file != NULL)
		{
			fclose(file);
			bExternalProgramTriggerDetected[id] = TRUE;
#pragma region Actions
			fprintf(logexternalprogramtriggerfile, "%f;%d;\n", GetTimeElapsedChronoQuick(&chrono), bExternalProgramTriggerDetected[id]);
			fflush(logexternalprogramtriggerfile);

			if (procid_externalprogramtrigger[id] != -1)
			{
				// disableexternalprogramtrigger to avoid multiple execute...
				bExternalProgramTrigger[id] = FALSE;
				for (i = 0; i < nbretries_externalprogramtrigger[id]; i++)
				{
					if (remove(ExternalProgramTriggerFileName[id]) == 0) break;
					uSleep(1000*retrydelay_externalprogramtrigger[id]);
				}
				if (bEcho) printf("execute %d\n", procid_externalprogramtrigger[id]);
				ExecuteProcedure(procid_externalprogramtrigger[id]);
				bWaiting = FALSE; // To interrupt and force execution of the next commands...
			}
#pragma endregion
		}

		LeaveCriticalSection(&ExternalProgramTriggerCS[id]);

		if (bExit) break;
	}

	StopChronoQuick(&chrono);

	fclose(logexternalprogramtriggerfile);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}